

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void es::init::empty_stack(void)

{
  _func_void *p_Var1;
  singletons_meta_data *psVar2;
  
  LOCK();
  _ZN2es4initL14clean_up_phaseE_0 = 1;
  UNLOCK();
  while( true ) {
    psVar2 = static_obj_stack<es::init::singletons_meta_data>::pop();
    if (psVar2 == (singletons_meta_data *)0x0) break;
    p_Var1 = psVar2->_func;
    if (p_Var1 != (_func_void *)0x0) {
      psVar2->_func = (_func_void *)0x0;
      (*p_Var1)();
    }
  }
  return;
}

Assistant:

inline void empty_stack()
{
    clean_up_phase = true;

    uint64_t n{0};
    while (auto p = stack::pop())
    {
        if constexpr (es::init::verbose_singletons)
        {
            std::cout << "empty_stack[" << n << "]: " << *p << std::endl;
            ++n;
        }
        if (auto f = p->_func)
        {
            p->_func = nullptr;
            f();
        }
    }
}